

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wavelets.cpp
# Opt level: O0

void lts2::SoftThresholding(Mat *src,Mat *thresholdedCoeffs,float threshold)

{
  int local_39c;
  float sign;
  int x;
  float *p_th;
  float *p_tsrc;
  float *p_src;
  MatSize local_378 [4];
  int y;
  Scalar_<double> local_370;
  Mat local_340 [352];
  MatExpr local_1e0 [352];
  Mat local_80 [8];
  Mat tmp;
  float threshold_local;
  Mat *thresholdedCoeffs_local;
  Mat *src_local;
  
  cv::Mat::Mat(local_80);
  cv::abs(local_340);
  cv::Scalar_<double>::Scalar_(&local_370,(double)threshold);
  cv::operator-(local_1e0,(Scalar_ *)local_340);
  cv::Mat::operator=(local_80,local_1e0);
  cv::MatExpr::~MatExpr(local_1e0);
  cv::MatExpr::~MatExpr((MatExpr *)local_340);
  cv::MatSize::operator()(local_378);
  cv::Mat::create(thresholdedCoeffs,local_378,5);
  for (p_src._4_4_ = 0; p_src._4_4_ < *(int *)(src + 8); p_src._4_4_ = p_src._4_4_ + 1) {
    p_tsrc = cv::Mat::ptr<float>(src,p_src._4_4_);
    p_th = cv::Mat::ptr<float>(local_80,p_src._4_4_);
    _sign = cv::Mat::ptr<float>(thresholdedCoeffs,p_src._4_4_);
    for (local_39c = 0; local_39c < *(int *)(src + 0xc); local_39c = local_39c + 1) {
      if (0.0 < *p_th) {
        *_sign = (float)(~-(uint)(0.0 < *p_tsrc) & 0xbf800000 | -(uint)(0.0 < *p_tsrc) & 0x3f800000)
                 * *p_th;
      }
      else {
        *_sign = 0.0;
      }
      _sign = _sign + 1;
      p_th = p_th + 1;
      p_tsrc = p_tsrc + 1;
    }
  }
  cv::Mat::~Mat(local_80);
  return;
}

Assistant:

void lts2::SoftThresholding(const cv::Mat &src, cv::Mat &thresholdedCoeffs, float threshold)
{
  cv::Mat tmp;
  tmp = cv::abs(src) - threshold;
    
  thresholdedCoeffs.create(src.size(), CV_32F);
    
  for (int y = 0; y < src.rows; ++y)
  {
    const float *p_src = src.ptr<float>(y);
    const float *p_tsrc = tmp.ptr<float>(y);
    float *p_th = thresholdedCoeffs.ptr<float>(y);
        
    for (int x = 0; x < src.cols; ++x, ++p_tsrc, ++p_src)
    {
      if (*p_tsrc <= 0.0f)
        *p_th++ = 0.0f;
      else
      {
        float sign = (*p_src > 0.0f) ? 1.0f: -1.0f;
        *p_th++ = sign * *p_tsrc;
      }
    }
  }
}